

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall chaiscript::parser::ChaiScript_Parser::Case(ChaiScript_Parser *this)

{
  bool bVar1;
  eval_error *this_00;
  undefined8 uVar2;
  long in_RDI;
  size_type prev_stack_top;
  bool retval;
  size_t in_stack_00000200;
  ChaiScript_Parser *in_stack_00000208;
  ChaiScript_Parser *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe78;
  string *t_fname;
  File_Position *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  allocator *paVar3;
  eval_error *in_stack_fffffffffffffe90;
  allocator local_131;
  string local_130 [6];
  undefined1 in_stack_fffffffffffffed6;
  char in_stack_fffffffffffffed7;
  ChaiScript_Parser *in_stack_fffffffffffffed8;
  ChaiScript_Parser *in_stack_fffffffffffffee0;
  File_Position local_10c;
  string local_100 [16];
  undefined8 in_stack_ffffffffffffff10;
  allocator local_d9;
  string local_d8 [35];
  undefined1 local_b5;
  File_Position local_b4;
  allocator local_a9;
  string local_a8 [8];
  string *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  ChaiScript_Parser *in_stack_ffffffffffffff70;
  File_Position local_84;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  File_Position local_54 [3];
  allocator local_39;
  string local_38 [32];
  size_type local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = std::
             vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                     *)(in_RDI + 0x70));
  bVar1 = Keyword(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                  (bool)in_stack_fffffffffffffed7);
  if (bVar1) {
    local_9 = 1;
    bVar1 = Char(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,(bool)in_stack_fffffffffffffed6
                );
    if (!bVar1) {
      local_55 = 1;
      uVar2 = __cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Incomplete \'case\' expression",&local_39);
      File_Position::File_Position(local_54,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe60);
      exception::eval_error::eval_error
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      local_55 = 0;
      __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar1 = Operator(in_stack_00000208,in_stack_00000200);
    if ((!bVar1) ||
       (bVar1 = Char(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,
                     (bool)in_stack_fffffffffffffed6), !bVar1)) {
      uVar2 = __cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"Incomplete \'case\' expression",&local_79);
      File_Position::File_Position(&local_84,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe60);
      exception::eval_error::eval_error
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar1 = Eol(in_stack_fffffffffffffe60);
    } while (bVar1);
    bVar1 = Block((ChaiScript_Parser *)in_stack_ffffffffffffff10);
    if (!bVar1) {
      local_b5 = 1;
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Incomplete \'case\' block",&local_a9);
      File_Position::File_Position(&local_b4,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe60);
      exception::eval_error::eval_error
                (this_00,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      local_b5 = 0;
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    paVar3 = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"",paVar3);
    build_match<chaiscript::eval::Case_AST_Node>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  else {
    bVar1 = Keyword(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                    (bool)in_stack_fffffffffffffed7);
    if (bVar1) {
      local_9 = 1;
      do {
        bVar1 = Eol(in_stack_fffffffffffffe60);
      } while (bVar1);
      bVar1 = Block((ChaiScript_Parser *)in_stack_ffffffffffffff10);
      if (!bVar1) {
        uVar2 = __cxa_allocate_exception(0x90);
        t_fname = (string *)&stack0xfffffffffffffeff;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,"Incomplete \'default\' block",(allocator *)t_fname);
        File_Position::File_Position(&local_10c,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffe60);
        exception::eval_error::eval_error
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   t_fname);
        __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"",&local_131);
      build_match<chaiscript::eval::Default_AST_Node>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool Case() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("case")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {}

          if (!Block()) {
            throw exception::eval_error("Incomplete 'case' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Case_AST_Node>(prev_stack_top);
        } else if (Keyword("default")) {
          retval = true;

          while (Eol()) {}

          if (!Block()) {
            throw exception::eval_error("Incomplete 'default' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Default_AST_Node>(prev_stack_top);
        }

        return retval;
      }